

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O2

void runpobj(runcxdef *ctx,objnum obj)

{
  undefined2 in_register_00000032;
  
  if (CONCAT22(in_register_00000032,obj) == 0xffff) {
    ctx->runcxsp->runstyp = '\x05';
  }
  else {
    (ctx->runcxsp->runsv).runsvobj = obj;
    ctx->runcxsp->runstyp = '\x02';
  }
  ctx->runcxsp = ctx->runcxsp + 1;
  return;
}

Assistant:

void runpobj(runcxdef *ctx, objnum obj)
{
    runsdef val;
    
    if (obj == MCMONINV)
        runpnil(ctx);
    else
    {
        val.runsv.runsvobj = obj;
        runpush(ctx, DAT_OBJECT, &val);
    }
}